

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_radix_scatter.cpp
# Opt level: O1

void duckdb::TemplatedRadixScatter<double>
               (UnifiedVectorFormat *vdata,SelectionVector *sel,idx_t add_count,
               data_ptr_t *key_locations,bool desc,bool has_null,bool nulls_first,idx_t offset)

{
  double dVar1;
  data_ptr_t pdVar2;
  sel_t *psVar3;
  unsigned_long *puVar4;
  data_ptr_t pdVar5;
  ulong *puVar6;
  bool bVar7;
  idx_t s;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  undefined7 in_register_00000089;
  
  pdVar2 = vdata->data;
  if ((int)CONCAT71(in_register_00000089,has_null) == 0) {
    if (add_count != 0) {
      uVar10 = 0;
      do {
        uVar8 = uVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)sel->sel_vector[uVar10];
        }
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          uVar8 = (ulong)psVar3[uVar8];
        }
        puVar6 = (ulong *)key_locations[uVar10];
        dVar1 = *(double *)(pdVar2 + uVar8 * 8 + offset * 8);
        if ((dVar1 != 0.0) || (uVar8 = 0x8000000000000000, NAN(dVar1))) {
          bVar7 = Value::IsNan<double>(dVar1);
          uVar8 = 0xffffffffffffffff;
          if ((!bVar7) && (uVar8 = 0xfffffffffffffffe, dVar1 <= 1.79769313486232e+308)) {
            if (-1.79769313486232e+308 <= dVar1) {
              uVar8 = ~(ulong)dVar1;
              if (-1 < (long)dVar1) {
                uVar8 = (ulong)dVar1 | 0x8000000000000000;
              }
            }
            else {
              uVar8 = 0;
            }
          }
        }
        *puVar6 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                  (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                  (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 | (uVar8 & 0xff00) << 0x28
                  | uVar8 << 0x38;
        if (desc) {
          lVar9 = 0;
          do {
            key_locations[uVar10][lVar9] = ~key_locations[uVar10][lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 8);
        }
        key_locations[uVar10] = key_locations[uVar10] + 8;
        uVar10 = uVar10 + 1;
      } while (uVar10 != add_count);
    }
  }
  else if (add_count != 0) {
    uVar10 = 0;
    do {
      uVar8 = uVar10;
      if (sel->sel_vector != (sel_t *)0x0) {
        uVar8 = (ulong)sel->sel_vector[uVar10];
      }
      psVar3 = vdata->sel->sel_vector;
      if (psVar3 != (sel_t *)0x0) {
        uVar8 = (ulong)psVar3[uVar8];
      }
      uVar8 = uVar8 + offset;
      puVar4 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar4 == (unsigned_long *)0x0) || ((puVar4[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0)) {
        *key_locations[uVar10] = nulls_first;
        pdVar5 = key_locations[uVar10];
        dVar1 = *(double *)(pdVar2 + uVar8 * 8);
        if ((dVar1 != 0.0) || (uVar8 = 0x8000000000000000, NAN(dVar1))) {
          bVar7 = Value::IsNan<double>(dVar1);
          uVar8 = 0xffffffffffffffff;
          if ((!bVar7) && (uVar8 = 0xfffffffffffffffe, dVar1 <= 1.79769313486232e+308)) {
            if (-1.79769313486232e+308 <= dVar1) {
              uVar8 = ~(ulong)dVar1;
              if (-1 < (long)dVar1) {
                uVar8 = (ulong)dVar1 | 0x8000000000000000;
              }
            }
            else {
              uVar8 = 0;
            }
          }
        }
        *(ulong *)(pdVar5 + 1) =
             uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
             (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
             (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
        if (desc) {
          lVar9 = 0;
          do {
            key_locations[uVar10][lVar9 + 1] = ~key_locations[uVar10][lVar9 + 1];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 8);
        }
      }
      else {
        *key_locations[uVar10] = !nulls_first;
        pdVar5 = key_locations[uVar10];
        pdVar5[1] = '\0';
        pdVar5[2] = '\0';
        pdVar5[3] = '\0';
        pdVar5[4] = '\0';
        pdVar5[5] = '\0';
        pdVar5[6] = '\0';
        pdVar5[7] = '\0';
        pdVar5[8] = '\0';
      }
      key_locations[uVar10] = key_locations[uVar10] + 9;
      uVar10 = uVar10 + 1;
    } while (uVar10 != add_count);
  }
  return;
}

Assistant:

void TemplatedRadixScatter(UnifiedVectorFormat &vdata, const SelectionVector &sel, idx_t add_count,
                           data_ptr_t *key_locations, const bool desc, const bool has_null, const bool nulls_first,
                           const idx_t offset) {
	auto source = UnifiedVectorFormat::GetData<T>(vdata);
	if (has_null) {
		auto &validity = vdata.validity;
		const data_t valid = nulls_first ? 1 : 0;
		const data_t invalid = 1 - valid;

		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;
			// write validity and according value
			if (validity.RowIsValid(source_idx)) {
				key_locations[i][0] = valid;
				Radix::EncodeData<T>(key_locations[i] + 1, source[source_idx]);
				// invert bits if desc
				if (desc) {
					for (idx_t s = 1; s < sizeof(T) + 1; s++) {
						*(key_locations[i] + s) = ~*(key_locations[i] + s);
					}
				}
			} else {
				key_locations[i][0] = invalid;
				memset(key_locations[i] + 1, '\0', sizeof(T));
			}
			key_locations[i] += sizeof(T) + 1;
		}
	} else {
		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;
			// write value
			Radix::EncodeData<T>(key_locations[i], source[source_idx]);
			// invert bits if desc
			if (desc) {
				for (idx_t s = 0; s < sizeof(T); s++) {
					*(key_locations[i] + s) = ~*(key_locations[i] + s);
				}
			}
			key_locations[i] += sizeof(T);
		}
	}
}